

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::DirectoryRecord::print<std::back_insert_iterator<std::__cxx11::string>>
          (DirectoryRecord *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  int MT_local;
  int MF_local;
  int MAT_local;
  _Head_base<3UL,_long,_false> local_20;
  long local_18;
  long local_10;
  long local_8;
  
  local_8 = (this->
            super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
            ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
            super__Head_base<0UL,_long,_false>._M_head_impl;
  local_10 = (this->
             super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_long,_long,_long>.super__Head_base<1UL,_long,_false>.
             _M_head_impl;
  local_18 = (this->
             super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
             ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
             super__Head_base<2UL,_long,_false>._M_head_impl;
  local_20._M_head_impl =
       (this->
       super_Base<njoy::ENDFtk::record::Integer<33>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>,_njoy::ENDFtk::record::Integer<11>_>
       ).fields.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
       super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>._M_head_impl;
  MT_local = MT;
  MF_local = MF;
  MAT_local = MAT;
  tools::disco::
  Record<njoy::tools::disco::Integer<33u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::write<std::back_insert_iterator<std::__cxx11::string>,long,long,long,long,int,int,int>
            (it,&local_8,&local_10,&local_18,&local_20._M_head_impl,&MAT_local,&MF_local,&MT_local);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;
  using Format = disco::Record< disco::Integer< 33 >, disco::Integer< 11 >,
                                disco::Integer< 11 >, disco::Integer< 11 >,
                                disco::Integer< 4 >, disco::Integer< 2 >,
                                disco::Integer< 3 >, disco::Column<5> >;
  Format::write( it, this->MF(), this->MT(),
                 this->NC(), this->MOD(), MAT, MF, MT );
}